

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExplicitImportSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  size_t sVar1;
  char *pcVar2;
  SourceLocation SVar3;
  size_t sVar4;
  char *pcVar5;
  ExplicitImportSymbol *pEVar6;
  
  pEVar6 = (ExplicitImportSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExplicitImportSymbol *)this->endPtr < pEVar6 + 1) {
    pEVar6 = (ExplicitImportSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pEVar6 + 1);
  }
  sVar4 = args->_M_len;
  pcVar5 = args->_M_str;
  sVar1 = args_1->_M_len;
  pcVar2 = args_1->_M_str;
  SVar3 = *args_2;
  (pEVar6->super_Symbol).kind = ExplicitImport;
  (pEVar6->super_Symbol).name._M_len = sVar1;
  (pEVar6->super_Symbol).name._M_str = pcVar2;
  (pEVar6->super_Symbol).location = SVar3;
  (pEVar6->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pEVar6->super_Symbol).parentScope = (Scope *)0x0;
  (pEVar6->super_Symbol).nextInScope = (Symbol *)0x0;
  (pEVar6->super_Symbol).indexInScope = 0;
  (pEVar6->packageName)._M_len = sVar4;
  (pEVar6->packageName)._M_str = pcVar5;
  (pEVar6->importName)._M_len = sVar1;
  (pEVar6->importName)._M_str = pcVar2;
  pEVar6->isFromExport = false;
  pEVar6->package_ = (PackageSymbol *)0x0;
  pEVar6->import = (Symbol *)0x0;
  pEVar6->initialized = false;
  return pEVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }